

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilder.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  LatticeFactory *this;
  Lattice *this_00;
  SimInfo *pSVar4;
  reference pvVar5;
  reference pvVar6;
  MoLocator *this_01;
  Molecule *mol;
  DumpWriter *this_02;
  int iVar7;
  int ny;
  size_type sVar8;
  int k;
  int nz;
  long lVar9;
  ulong uVar10;
  int iVar11;
  size_t i;
  size_type sVar12;
  ulong uVar13;
  bool bVar14;
  undefined4 uVar15;
  int remaining;
  undefined1 local_2ab8 [16];
  double local_2aa0;
  vector<double,_std::allocator<double>_> molFractions;
  vector<int,_std::allocator<int>_> nMol;
  vector<int,_std::allocator<int>_> ids;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> sites;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticeOrt;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticePos;
  vector<double,_std::allocator<double>_> lc;
  RealType latticeConstant;
  string outputFileName;
  string latticeType;
  vector<double,_std::allocator<double>_> molecularMasses;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> components;
  string inputFileName;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> orientations;
  _Vector_base<int,_std::allocator<int>_> local_28e8;
  SimCreator newCreator;
  SimCreator oldCreator;
  gengetopt_args_info args_info;
  Mat3x3d hmat;
  random_device rd;
  mt19937 gen;
  
  OpenMD::registerLattice();
  latticeType._M_dataplus._M_p = (pointer)&latticeType.field_2;
  latticeType._M_string_length = 0;
  inputFileName._M_dataplus._M_p = (pointer)&inputFileName.field_2;
  inputFileName._M_string_length = 0;
  outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
  outputFileName._M_string_length = 0;
  latticeType.field_2._M_local_buf[0] = '\0';
  inputFileName.field_2._M_local_buf[0] = '\0';
  outputFileName.field_2._M_local_buf[0] = '\0';
  lc.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  lc.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  lc.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  OpenMD::SquareMatrix<double,_3>::SquareMatrix(&hmat.super_SquareMatrix<double,_3>);
  latticePos.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  latticePos.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  latticePos.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  latticeOrt.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  latticeOrt.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  latticeOrt.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = cmdline_parser(argc,argv,&args_info);
  if (iVar2 == 0) {
    std::__cxx11::string::assign((char *)&latticeType);
    if (args_info.lattice_given != 0) {
      std::__cxx11::string::assign((char *)&latticeType);
    }
    this = OpenMD::LatticeFactory::getInstance();
    this_00 = OpenMD::LatticeFactory::createLattice(this,&latticeType);
    if (this_00 == (Lattice *)0x0) {
      snprintf(painCave.errMsg,2000,"Lattice Factory can not create %s lattice\n",
               latticeType._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    uVar3 = this_00->nCellSites;
    if (args_info.nx_arg < 1) {
      memcpy(&painCave,"The number of unit cells in the x direction must be greater than 0.",0x44);
      painCave.isFatal = 1;
      simError();
    }
    if (args_info.ny_arg < 1) {
      memcpy(&painCave,"The number of unit cells in the y direction must be greater than 0.",0x44);
      painCave.isFatal = 1;
      simError();
    }
    if (args_info.nz_arg < 1) {
      memcpy(&painCave,"The number of unit cells in the z direction must be greater than 0.",0x44);
      painCave.isFatal = 1;
      simError();
    }
    if (args_info.inputs_num == 0) {
      builtin_strncpy(painCave.errMsg + 0x30,"mand line",10);
      builtin_strncpy(painCave.errMsg + 0x20,"ified on the com",0x10);
      builtin_strncpy(painCave.errMsg + 0x10,"le name was spec",0x10);
      builtin_strncpy(painCave.errMsg,"No input .omd fi",0x10);
      painCave.isFatal = 1;
      simError();
    }
    else {
      std::__cxx11::string::assign((char *)&inputFileName);
    }
    oldCreator.mdFileName_._M_dataplus._M_p = (pointer)&oldCreator.mdFileName_.field_2;
    oldCreator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002be148;
    oldCreator.mdFileName_._M_string_length = 0;
    oldCreator.mdFileName_.field_2._M_local_buf[0] = '\0';
    pSVar4 = OpenMD::SimCreator::createSim(&oldCreator,&inputFileName,false);
    std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::vector
              (&components,&pSVar4->simParams_->components_);
    molFractions.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    molFractions.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    molFractions.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    molecularMasses.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    molecularMasses.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    molecularMasses.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    nMol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    nMol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    nMol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    sVar8 = (long)components.
                  super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)components.
                  super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if ((long)components.
              super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)components.
              super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8) {
      rd.field_0._M_mt._M_x[0] = 0x3ff0000000000000;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&molFractions,(double *)&rd);
    }
    else {
      uVar10 = (ulong)args_info.molFraction_given;
      if (sVar8 == uVar10) {
        lVar9 = 0;
        sVar12 = sVar8;
        while (bVar14 = sVar12 != 0, sVar12 = sVar12 - 1, bVar14) {
          std::vector<double,_std::allocator<double>_>::push_back
                    (&molFractions,(value_type_conflict2 *)((long)args_info.molFraction_arg + lVar9)
                    );
          lVar9 = lVar9 + 8;
        }
      }
      else if (sVar8 - 1 == uVar10) {
        rd.field_0._M_mt._M_x[0] = 0x3ff0000000000000;
        for (lVar9 = 0; uVar10 << 3 != lVar9; lVar9 = lVar9 + 8) {
          std::vector<double,_std::allocator<double>_>::push_back
                    (&molFractions,(value_type_conflict2 *)((long)args_info.molFraction_arg + lVar9)
                    );
          rd.field_0.field_0._M_file =
               (void *)((double)rd.field_0.field_0._M_file -
                       *(double *)
                        ((long)molFractions.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar9));
        }
        std::vector<double,_std::allocator<double>_>::push_back
                  (&molFractions,(value_type_conflict2 *)&rd);
      }
      else {
        memcpy(&painCave,
               "randomBuilder can\'t figure out molFractions for all of the components in the <MetaData> block."
               ,0x5f);
        painCave.isFatal = 1;
        simError();
      }
    }
    iVar2 = args_info.ny_arg * args_info.nz_arg * args_info.nx_arg * uVar3;
    local_2ab8 = ZEXT816(0);
    for (sVar12 = 0; sVar8 != sVar12; sVar12 = sVar12 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&molFractions,sVar12);
      if (*pvVar5 <= 0.0 && *pvVar5 != 0.0) {
        builtin_strncpy(painCave.errMsg,"One of the requested molFractions was less than zero!",0x36
                       );
        painCave.isFatal = 1;
        simError();
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&molFractions,sVar12);
      if (1.0 < *pvVar5) {
        builtin_strncpy(painCave.errMsg,"One of the requested molFractions was greater than one!",
                        0x38);
        painCave.isFatal = 1;
        simError();
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&molFractions,sVar12);
      uVar15 = local_2ab8._12_4_;
      local_2ab8._8_4_ = local_2ab8._8_4_;
      local_2ab8._0_8_ = local_2ab8._0_8_ + *pvVar5;
      local_2ab8._12_4_ = uVar15;
    }
    if (1e-06 < ABS((double)local_2ab8._0_8_ + -1.0)) {
      builtin_strncpy(painCave.errMsg,"The sum of molFractions was not close enough to 1.0",0x34);
      painCave.isFatal = 1;
      simError();
    }
    local_2aa0 = (double)iVar2;
    remaining = iVar2;
    for (sVar12 = 0; sVar8 - 1 != sVar12; sVar12 = sVar12 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&molFractions,sVar12);
      rd.field_0._M_mt._M_x[0]._0_4_ = (int)(*pvVar5 * local_2aa0);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&nMol,(int *)&rd);
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(&nMol,sVar12);
      remaining = remaining - *pvVar6;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&nMol,&remaining);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_2ab8._8_8_;
    local_2ab8 = auVar1 << 0x40;
    lVar9 = 0;
    iVar7 = 0;
    for (sVar12 = 0; sVar8 != sVar12; sVar12 = sVar12 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(&nMol,sVar12);
      molFractions.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar12] = (double)*pvVar6 / local_2aa0;
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(&nMol,sVar12);
      iVar7 = iVar7 + *pvVar6;
      rd.field_0.field_0._M_file =
           (void *)OpenMD::MoLocator::getMolMass
                             (*(MoleculeStamp **)
                               ((long)(pSVar4->moleculeStamps_).
                                      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (lVar9 >> 0x1d)),
                              pSVar4->forceField_);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&molecularMasses,(double *)&rd);
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(&nMol,sVar12);
      iVar11 = *pvVar6;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&molecularMasses,sVar12);
      local_2ab8._0_8_ = (double)local_2ab8._0_8_ + (double)iVar11 * *pvVar5;
      lVar9 = lVar9 + 0x100000000;
    }
    if (iVar7 != iVar2) {
      memcpy(&painCave,
             "Computed total number of molecules is not equal to the number of lattice sites!",0x50)
      ;
      painCave.isFatal = 1;
      simError();
    }
    latticeConstant =
         pow(((double)(int)uVar3 * 1.661 * ((double)local_2ab8._0_8_ / (double)iVar7)) /
             args_info.density_arg,0.3333333333333333);
    std::vector<double,_std::allocator<double>_>::push_back(&lc,&latticeConstant);
    (*this_00->_vptr_Lattice[3])(this_00,&lc);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)&rd,
               &this_00->cellSitesOrt);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::_M_move_assign
              (&latticeOrt,&rd);
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base((_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   *)&rd);
    sites.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    orientations.
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sites.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sites.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    orientations.
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    orientations.
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar13 = 0;
    uVar10 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar10 = uVar13;
    }
    iVar2 = 0;
    if (0 < args_info.nz_arg) {
      iVar2 = args_info.nz_arg;
    }
    local_2ab8._0_4_ = iVar2;
    iVar2 = 0;
    if (0 < args_info.ny_arg) {
      iVar2 = args_info.ny_arg;
    }
    iVar7 = 0;
    if (0 < args_info.nx_arg) {
      iVar7 = args_info.nx_arg;
    }
    while (iVar11 = (int)uVar13, iVar11 != iVar7) {
      for (ny = 0; ny != iVar2; ny = ny + 1) {
        local_2aa0 = (double)CONCAT44(local_2aa0._4_4_,ny);
        for (nz = 0; nz != local_2ab8._0_4_; nz = nz + 1) {
          OpenMD::Lattice::getLatticePointsPos(this_00,&latticePos,iVar11,ny,nz);
          for (lVar9 = 0; uVar10 * 0x18 - lVar9 != 0; lVar9 = lVar9 + 0x18) {
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back(&sites,(value_type *)
                             ((long)((latticePos.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_Vector<double,_3U>).data_ + lVar9));
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back(&orientations,
                      (value_type *)
                      ((long)((latticeOrt.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>)
                             .data_ + lVar9));
          }
          ny = local_2aa0._0_4_;
        }
      }
      uVar13 = (ulong)(iVar11 + 1);
    }
    std::__cxx11::string::assign((char *)&outputFileName);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_28e8,&nMol);
    createMdFile(&inputFileName,&outputFileName,(vector<int,_std::allocator<int>_> *)&local_28e8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28e8);
    (*pSVar4->_vptr_SimInfo[1])();
    newCreator.mdFileName_._M_dataplus._M_p = (pointer)&newCreator.mdFileName_.field_2;
    newCreator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002be148;
    newCreator.mdFileName_._M_string_length = 0;
    newCreator.mdFileName_.field_2._M_local_buf[0] = '\0';
    pSVar4 = OpenMD::SimCreator::createSim(&newCreator,&outputFileName,false);
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)args_info.nx_arg * latticeConstant;
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         (double)args_info.ny_arg * latticeConstant;
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         (double)args_info.nz_arg * latticeConstant;
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    OpenMD::Snapshot::setHmat(pSVar4->sman_->currentSnapshot_,&hmat);
    ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    for (uVar10 = 0;
        uVar10 < (ulong)(((long)sites.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)sites.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar10 = uVar10 + 1) {
      rd.field_0._M_mt._M_x[0]._0_4_ = (int)uVar10;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&ids,(int *)&rd);
    }
    std::random_device::random_device(&rd);
    uVar3 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&gen,(ulong)uVar3);
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,&gen);
    lVar9 = 0;
    for (sVar12 = 0; sVar12 != sVar8; sVar12 = sVar12 + 1) {
      this_01 = (MoLocator *)operator_new(0x30);
      OpenMD::MoLocator::MoLocator
                (this_01,(pSVar4->moleculeStamps_).
                         super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[(int)sVar12],pSVar4->forceField_)
      ;
      iVar7 = (int)lVar9;
      lVar9 = (long)iVar7;
      iVar2 = 0;
      while( true ) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(&nMol,sVar12);
        if (*pvVar6 <= iVar2) break;
        mol = OpenMD::SimInfo::getMoleculeByGlobalIndex(pSVar4,iVar7 + iVar2);
        OpenMD::MoLocator::placeMol
                  (this_01,sites.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar9],
                   orientations.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_start[lVar9],mol);
        lVar9 = lVar9 + 1;
        iVar2 = iVar2 + 1;
      }
    }
    this_02 = (DumpWriter *)operator_new(0x60);
    OpenMD::DumpWriter::DumpWriter(this_02,pSVar4,&outputFileName);
    OpenMD::DumpWriter::writeDump(this_02);
    OpenMD::DumpWriter::~DumpWriter(this_02);
    operator_delete(this_02,0x60);
    snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
             outputFileName._M_dataplus._M_p);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
    std::random_device::~random_device(&rd);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&ids.super__Vector_base<int,_std::allocator<int>_>);
    OpenMD::SimCreator::~SimCreator(&newCreator);
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&orientations.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&sites.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&nMol.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&molecularMasses.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&molFractions.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::~_Vector_base
              (&components.
                super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>);
    OpenMD::SimCreator::~SimCreator(&oldCreator);
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&latticeOrt.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&latticePos.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&lc.super__Vector_base<double,_std::allocator<double>_>);
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__cxx11::string::~string((string *)&inputFileName);
    std::__cxx11::string::~string((string *)&latticeType);
    return 0;
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  registerLattice();

  gengetopt_args_info args_info;
  std::string latticeType;
  std::string inputFileName;
  std::string outputFileName;
  Lattice* simpleLat;
  RealType latticeConstant;
  std::vector<RealType> lc;
  const RealType rhoConvertConst = 1.661;
  RealType density;
  int nx, ny, nz;
  Mat3x3d hmat;
  MoLocator* locator;
  std::vector<Vector3d> latticePos;
  std::vector<Vector3d> latticeOrt;
  int nMolPerCell;
  DumpWriter* writer;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  density = args_info.density_arg;

  // get lattice type
  latticeType = "FCC";
  if (args_info.lattice_given) { latticeType = args_info.lattice_arg; }

  simpleLat = LatticeFactory::getInstance().createLattice(latticeType);

  if (simpleLat == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Lattice Factory can not create %s lattice\n",
             latticeType.c_str());
    painCave.isFatal = 1;
    simError();
  }
  nMolPerCell = simpleLat->getNumSitesPerCell();

  // get the number of unit cells in each direction:

  nx = args_info.nx_arg;

  if (nx <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the x direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  ny = args_info.ny_arg;

  if (ny <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the y direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  nz = args_info.nz_arg;

  if (nz <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the z direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  int nSites = nMolPerCell * nx * ny * nz;

  // get input file name
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input .omd file name was specified "
             "on the command line");
    painCave.isFatal = 1;
    simError();
  }

  // parse md file and set up the system

  SimCreator oldCreator;
  SimInfo* oldInfo   = oldCreator.createSim(inputFileName, false);
  Globals* simParams = oldInfo->getSimParams();

  // Calculate lattice constant (in Angstroms)

  std::vector<Component*> components = simParams->getComponents();
  std::vector<RealType> molFractions;
  std::vector<RealType> molecularMasses;
  std::vector<int> nMol;
  std::size_t nComponents = components.size();

  if (nComponents == 1) {
    molFractions.push_back(1.0);
  } else {
    if (args_info.molFraction_given == nComponents) {
      for (std::size_t i = 0; i < nComponents; i++) {
        molFractions.push_back(args_info.molFraction_arg[i]);
      }
    } else if (args_info.molFraction_given == nComponents - 1) {
      RealType remainingFraction = 1.0;
      for (std::size_t i = 0; i < nComponents - 1; i++) {
        molFractions.push_back(args_info.molFraction_arg[i]);
        remainingFraction -= molFractions[i];
      }
      molFractions.push_back(remainingFraction);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "randomBuilder can't figure out molFractions "
               "for all of the components in the <MetaData> block.");
      painCave.isFatal = 1;
      simError();
    }
  }

  // do some sanity checking:

  RealType totalFraction = 0.0;

  for (std::size_t i = 0; i < nComponents; i++) {
    if (molFractions.at(i) < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "One of the requested molFractions was"
               " less than zero!");
      painCave.isFatal = 1;
      simError();
    }
    if (molFractions.at(i) > 1.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "One of the requested molFractions was"
               " greater than one!");
      painCave.isFatal = 1;
      simError();
    }
    totalFraction += molFractions.at(i);
  }
  if (abs(totalFraction - 1.0) > 1e-6) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The sum of molFractions was not close enough to 1.0");
    painCave.isFatal = 1;
    simError();
  }

  int remaining = nSites;
  for (std::size_t i = 0; i < nComponents - 1; i++) {
    nMol.push_back(int((RealType)nSites * molFractions.at(i)));
    remaining -= nMol.at(i);
  }
  nMol.push_back(remaining);

  // recompute actual mol fractions and perform final sanity check:

  int totalMolecules = 0;
  RealType totalMass = 0.0;
  for (std::size_t i = 0; i < nComponents; i++) {
    molFractions[i] = (RealType)(nMol.at(i)) / (RealType)nSites;
    totalMolecules += nMol.at(i);
    molecularMasses.push_back(MoLocator::getMolMass(
        oldInfo->getMoleculeStamp(i), oldInfo->getForceField()));
    totalMass += (RealType)(nMol.at(i)) * molecularMasses.at(i);
  }
  RealType avgMass = totalMass / (RealType)totalMolecules;

  if (totalMolecules != nSites) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Computed total number of molecules is not equal "
             "to the number of lattice sites!");
    painCave.isFatal = 1;
    simError();
  }

  latticeConstant = pow(rhoConvertConst * nMolPerCell * avgMass / density,
                        (RealType)(1.0 / 3.0));

  // Set the lattice constant

  lc.push_back(latticeConstant);
  simpleLat->setLatticeConstant(lc);

  // Calculate the lattice sites and fill the lattice vector.

  // Get the standard orientations of the cell sites

  latticeOrt = simpleLat->getLatticePointsOrt();

  vector<Vector3d> sites;
  vector<Vector3d> orientations;

  for (int i = 0; i < nx; i++) {
    for (int j = 0; j < ny; j++) {
      for (int k = 0; k < nz; k++) {
        // Get the position of the cell sites

        simpleLat->getLatticePointsPos(latticePos, i, j, k);

        for (int l = 0; l < nMolPerCell; l++) {
          sites.push_back(latticePos[l]);
          orientations.push_back(latticeOrt[l]);
        }
      }
    }
  }

  outputFileName = args_info.output_arg;

  // create a new .omd file on the fly which corrects the number of molecules

  createMdFile(inputFileName, outputFileName, nMol);

  delete oldInfo;

  // We need to read in the new SimInfo object, then Parse the
  // md file and set up the system

  SimCreator newCreator;
  SimInfo* newInfo = newCreator.createSim(outputFileName, false);

  // fill Hmat

  hmat(0, 0) = nx * latticeConstant;
  hmat(0, 1) = 0.0;
  hmat(0, 2) = 0.0;

  hmat(1, 0) = 0.0;
  hmat(1, 1) = ny * latticeConstant;
  hmat(1, 2) = 0.0;

  hmat(2, 0) = 0.0;
  hmat(2, 1) = 0.0;
  hmat(2, 2) = nz * latticeConstant;

  // Set Hmat

  newInfo->getSnapshotManager()->getCurrentSnapshot()->setHmat(hmat);

  // place the molecules

  // Randomize a vector of ints:

  vector<int> ids;
  for (std::size_t i = 0; i < sites.size(); i++)
    ids.push_back(i);

  /* Set up the random number generator engine */
  std::random_device rd;   // Non-deterministic, uniformly-distributed integer
                           // random number generator
  std::mt19937 gen(rd());  // 32-bit Mersenne Twister random number engine

  std::shuffle(ids.begin(), ids.end(), gen);

  Molecule* mol;
  int l = 0;
  for (std::size_t i = 0; i < nComponents; i++) {
    locator =
        new MoLocator(newInfo->getMoleculeStamp(i), newInfo->getForceField());
    for (int n = 0; n < nMol.at(i); n++) {
      mol = newInfo->getMoleculeByGlobalIndex(l);
      locator->placeMol(sites[ids[l]], orientations[ids[l]], mol);
      l++;
    }
  }

  // Create DumpWriter and write out the coordinates

  writer = new DumpWriter(newInfo, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.isFatal = 1;
    simError();
  }

  writer->writeDump();

  // deleting the writer will put the closing at the end of the dump file.

  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been "
           "generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}